

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::FileDescriptorStream::flush(FileDescriptorStream *this)

{
  flush((FileDescriptorStream *)
        ((long)&(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream +
        (long)(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-5]))
  ;
  return;
}

Assistant:

virtual void flush()
		{
			assert(fd >= 0);

#ifdef MACOSX
			if (fsync(fd) < 0)
#else
			if (fdatasync(fd) < 0)
#endif
			{
				fail(DashelException::IOError, errno, "File flush error.");
			}
		}